

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataExtractor.cpp
# Opt level: O2

uint64_t __thiscall
llvm::DataExtractor::getULEB128(DataExtractor *this,uint64_t *offset_ptr,Error *Err)

{
  bool bVar1;
  ulong uVar2;
  uint64_t uVar3;
  char *pcVar4;
  error_code EC;
  char *local_48;
  char *error;
  ErrorAsOutParameter local_38;
  ErrorAsOutParameter ErrAsOut;
  uint bytes_read;
  
  if ((this->Data).Length < *offset_ptr) {
    __assert_fail("*offset_ptr <= Data.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/DataExtractor.cpp"
                  ,0xb0,"uint64_t llvm::DataExtractor::getULEB128(uint64_t *, llvm::Error *) const")
    ;
  }
  if (Err != (Error *)0x0) {
    uVar2 = (ulong)Err->Payload & 0xfffffffffffffffe;
    Err->Payload = (ErrorInfoBase *)(uVar2 != 0 | uVar2);
  }
  local_38.Err = Err;
  bVar1 = isError(Err);
  if (!bVar1) {
    pcVar4 = (this->Data).Data;
    uVar3 = decodeULEB128((uint8_t *)(pcVar4 + *offset_ptr),(uint *)((long)&ErrAsOut.Err + 4),
                          (uint8_t *)(pcVar4 + (this->Data).Length),&local_48);
    if (local_48 == (char *)0x0) {
      *offset_ptr = *offset_ptr + (ulong)ErrAsOut.Err._4_4_;
      goto LAB_00d676c2;
    }
    if (Err != (Error *)0x0) {
      pcVar4 = (char *)std::_V2::generic_category();
      EC._M_cat = (error_category *)0x54;
      EC._0_8_ = &error;
      createStringError(EC,pcVar4);
      Err->Payload = (ErrorInfoBase *)((ulong)error | 1);
    }
  }
  uVar3 = 0;
LAB_00d676c2:
  ErrorAsOutParameter::~ErrorAsOutParameter(&local_38);
  return uVar3;
}

Assistant:

uint64_t DataExtractor::getULEB128(uint64_t *offset_ptr,
                                   llvm::Error *Err) const {
  assert(*offset_ptr <= Data.size());
  ErrorAsOutParameter ErrAsOut(Err);
  if (isError(Err))
    return 0;

  const char *error;
  unsigned bytes_read;
  uint64_t result = decodeULEB128(
      reinterpret_cast<const uint8_t *>(Data.data() + *offset_ptr), &bytes_read,
      reinterpret_cast<const uint8_t *>(Data.data() + Data.size()), &error);
  if (error) {
    if (Err)
      *Err = createStringError(errc::illegal_byte_sequence, error);
    return 0;
  }
  *offset_ptr += bytes_read;
  return result;
}